

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O0

void FunctionalTester<unsigned_long_long,_void>::Test(void)

{
  unsigned_long_long uVar1;
  char *pcVar2;
  char local_98 [8];
  char buf2 [64];
  char buf1 [64];
  TestWatcher<unsigned_long_long> local_9 [8];
  TestWatcher<unsigned_long_long> tw;
  
  TestWatcher<unsigned_long_long>::TestWatcher(local_9);
  uVar1 = std::numeric_limits<unsigned_long_long>::min();
  int2str::convert_with_zero<unsigned_long_long,char*>(uVar1,buf2 + 0x38);
  pcVar2 = PrintfFormat<unsigned_long_long>();
  uVar1 = std::numeric_limits<unsigned_long_long>::min();
  sprintf(local_98,pcVar2,uVar1);
  StrcmpAndExit(buf2 + 0x38,local_98);
  uVar1 = std::numeric_limits<unsigned_long_long>::max();
  int2str::convert_with_zero<unsigned_long_long,char*>(uVar1,buf2 + 0x38);
  pcVar2 = PrintfFormat<unsigned_long_long>();
  uVar1 = std::numeric_limits<unsigned_long_long>::max();
  sprintf(local_98,pcVar2,uVar1);
  StrcmpAndExit(buf2 + 0x38,local_98);
  TestWatcher<unsigned_long_long>::~TestWatcher(local_9);
  return;
}

Assistant:

static void Test()
    {
        TestWatcher<T> const tw;
        char buf1[64];
        char buf2[64];
        int2str::convert_with_zero(std::numeric_limits<T>::min(), buf1);
        sprintf(buf2, PrintfFormat<T>(), std::numeric_limits<T>::min());
        StrcmpAndExit(buf1, buf2);
        int2str::convert_with_zero(std::numeric_limits<T>::max(), buf1);
        sprintf(buf2, PrintfFormat<T>(), std::numeric_limits<T>::max());
        StrcmpAndExit(buf1, buf2);
    }